

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O1

void __thiscall sparse_parameters::shallow_copy(sparse_parameters *this,sparse_parameters *input)

{
  float *__dest;
  _Hash_node_base *p_Var1;
  
  p_Var1 = (this->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0 && this->_seeded == false) {
    do {
      free(p_Var1[2]._M_nxt);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  if (input != this) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this,(_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)input);
  }
  this->_weight_mask = input->_weight_mask;
  this->_stride_shift = input->_stride_shift;
  free(this->default_value);
  __dest = calloc_or_throw<float>(1L << ((byte)this->_stride_shift & 0x3f));
  this->default_value = __dest;
  memcpy(__dest,input->default_value,1L << ((byte)this->_stride_shift & 0x3f));
  this->default_data = input->default_data;
  this->_seeded = true;
  return;
}

Assistant:

void shallow_copy(const sparse_parameters& input)
  {
    // TODO: this is level-1 copy (weight* are stilled shared)
    if (!_seeded)
    {
      for (auto iter = _map.begin(); iter != _map.end(); ++iter) free(iter->second);
    }
    _map = input._map;
    _weight_mask = input._weight_mask;
    _stride_shift = input._stride_shift;
    free(default_value);
    default_value = calloc_mergable_or_throw<weight>(stride());
    memcpy(default_value, input.default_value, stride());
    default_data = input.default_data;
    _seeded = true;
  }